

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

int duckdb_brotli::BrotliDecoderAttachDictionary
              (BrotliDecoderStateInternal *state,BrotliSharedDictionaryType type,size_t data_size,
              uint8_t *data)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  BrotliSharedDictionary *pBVar5;
  BrotliDecoderCompoundDictionary *pBVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = 0;
  if (state->state == BROTLI_STATE_UNINITED) {
    uVar1 = state->dictionary->num_prefix;
    uVar8 = (ulong)uVar1;
    iVar4 = BrotliSharedDictionaryAttach(state->dictionary,type,data_size,data);
    iVar7 = 0;
    if (iVar4 != 0) {
      pBVar5 = state->dictionary;
      if (uVar1 < pBVar5->num_prefix) {
        do {
          if (state->state != BROTLI_STATE_UNINITED) {
            return 0;
          }
          sVar2 = pBVar5->prefix_size[uVar8];
          puVar3 = pBVar5->prefix[uVar8];
          pBVar6 = state->compound_dictionary;
          if (pBVar6 == (BrotliDecoderCompoundDictionary *)0x0) {
            pBVar6 = (BrotliDecoderCompoundDictionary *)
                     (*state->alloc_func)(state->memory_manager_opaque,0x1e0);
            if (pBVar6 == (BrotliDecoderCompoundDictionary *)0x0) {
              return 0;
            }
            iVar4 = 0;
            pBVar6->num_chunks = 0;
            pBVar6->total_size = 0;
            pBVar6->br_length = 0;
            pBVar6->br_copied = 0;
            pBVar6->block_bits = -1;
            pBVar6->chunk_offsets[0] = 0;
            state->compound_dictionary = pBVar6;
            iVar7 = 0;
          }
          else {
            iVar7 = pBVar6->num_chunks;
            if (iVar7 == 0xf) {
              return 0;
            }
            iVar4 = pBVar6->total_size;
          }
          pBVar6->chunks[iVar7] = puVar3;
          pBVar6->num_chunks = iVar7 + 1;
          iVar4 = (int)sVar2 + iVar4;
          pBVar6->total_size = iVar4;
          pBVar6->chunk_offsets[(long)iVar7 + 1] = iVar4;
          uVar8 = uVar8 + 1;
          pBVar5 = state->dictionary;
        } while (uVar8 < pBVar5->num_prefix);
      }
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

BROTLI_BOOL BrotliDecoderAttachDictionary(BrotliDecoderState *state, BrotliSharedDictionaryType type, size_t data_size,
                                          const uint8_t data[BROTLI_ARRAY_PARAM(data_size)]) {
	brotli_reg_t i;
	brotli_reg_t num_prefix_before = state->dictionary->num_prefix;
	if (state->state != BROTLI_STATE_UNINITED)
		return BROTLI_FALSE;
	if (!BrotliSharedDictionaryAttach(state->dictionary, type, data_size, data)) {
		return BROTLI_FALSE;
	}
	for (i = num_prefix_before; i < state->dictionary->num_prefix; i++) {
		if (!AttachCompoundDictionary(state, state->dictionary->prefix[i], state->dictionary->prefix_size[i])) {
			return BROTLI_FALSE;
		}
	}
	return BROTLI_TRUE;
}